

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join.c
# Opt level: O3

int run_test_udp_multicast_join(void)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv__queue *unaff_RBX;
  uv__queue *puVar5;
  uv_handle_t *puVar6;
  uv_udp_t *puVar7;
  uv_handle_t **ppuVar8;
  code **ppcVar9;
  ulong in_R8;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  code *apcStack_100 [2];
  undefined8 uStack_f0;
  code *pcStack_e8;
  undefined8 uStack_e0;
  undefined1 auStack_d8 [24];
  undefined1 auStack_c0 [16];
  uv__queue *puStack_b0;
  uv_handle_t *puStack_a8;
  undefined8 uStack_a0;
  ulong auStack_98 [8];
  uv__queue *puStack_58;
  undefined8 uStack_48;
  undefined1 auStack_40 [16];
  undefined1 local_30 [16];
  undefined1 local_20 [16];
  uv__queue *puVar4;
  
  auStack_40._0_8_ = (uv__queue *)0x1ddc85;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_20);
  local_30._8_8_ = SEXT48(iVar1);
  local_30._0_8_ = (uv__queue *)0x0;
  if ((uv__queue *)local_30._8_8_ == (uv__queue *)0x0) {
    auStack_40._0_8_ = (uv__queue *)0x1ddcaa;
    uVar2 = uv_default_loop();
    auStack_40._0_8_ = (uv__queue *)0x1ddcb9;
    iVar1 = uv_udp_init(uVar2,&server);
    local_30._8_8_ = SEXT48(iVar1);
    local_30._0_8_ = (uv__queue *)0x0;
    if ((uv__queue *)local_30._8_8_ != (uv__queue *)0x0) goto LAB_001ddf52;
    auStack_40._0_8_ = (uv__queue *)0x1ddcde;
    uVar2 = uv_default_loop();
    auStack_40._0_8_ = (uv__queue *)0x1ddced;
    iVar1 = uv_udp_init(uVar2,&client);
    local_30._8_8_ = SEXT48(iVar1);
    local_30._0_8_ = (uv__queue *)0x0;
    if ((uv__queue *)local_30._8_8_ != (uv__queue *)0x0) goto LAB_001ddf61;
    auStack_40._0_8_ = (uv__queue *)0x1ddd20;
    iVar1 = uv_udp_bind(&server,local_20,0);
    local_30._8_8_ = SEXT48(iVar1);
    local_30._0_8_ = (uv__queue *)0x0;
    if ((uv__queue *)local_30._8_8_ != (uv__queue *)0x0) goto LAB_001ddf70;
    auStack_40._0_8_ = (uv__queue *)0x1ddd5a;
    iVar1 = uv_udp_set_membership(&server,"239.255.0.1",0,1);
    if (iVar1 == -0x13) {
      auStack_40._0_8_ = (uv__queue *)0x1ddf3c;
      run_test_udp_multicast_join_cold_15();
      return 7;
    }
    local_30._8_8_ = SEXT48(iVar1);
    local_30._0_8_ = (uv__queue *)0x0;
    if ((uv__queue *)local_30._8_8_ != (uv__queue *)0x0) goto LAB_001ddf7f;
    auStack_40._0_8_ = (uv__queue *)0x1ddd9d;
    iVar1 = uv_udp_recv_start(&server,alloc_cb,cl_recv_cb);
    local_30._8_8_ = SEXT48(iVar1);
    local_30._0_8_ = (uv__queue *)0x0;
    if ((uv__queue *)local_30._8_8_ != (uv__queue *)0x0) goto LAB_001ddf8e;
    auStack_40._0_8_ = (uv__queue *)0x1dddc9;
    iVar1 = do_send(&req);
    local_30._8_8_ = SEXT48(iVar1);
    local_30._0_8_ = (uv__queue *)0x0;
    if ((uv__queue *)local_30._8_8_ != (uv__queue *)0x0) goto LAB_001ddf9d;
    local_30._8_8_ = SEXT48(close_cb_called);
    local_30._0_8_ = (uv__queue *)0x0;
    if ((uv__queue *)local_30._8_8_ != (uv__queue *)0x0) goto LAB_001ddfac;
    local_30._8_8_ = SEXT48(cl_recv_cb_called);
    local_30._0_8_ = (uv__queue *)0x0;
    if ((uv__queue *)local_30._8_8_ != (uv__queue *)0x0) goto LAB_001ddfbb;
    local_30._8_8_ = SEXT48(sv_send_cb_called);
    local_30._0_8_ = (uv__queue *)0x0;
    if ((uv__queue *)local_30._8_8_ != (uv__queue *)0x0) goto LAB_001ddfca;
    auStack_40._0_8_ = (uv__queue *)0x1dde5d;
    uVar2 = uv_default_loop();
    auStack_40._0_8_ = (uv__queue *)0x1dde67;
    uv_run(uVar2,0);
    local_30._8_8_ = (uv__queue *)0x2;
    local_30._0_8_ = SEXT48(cl_recv_cb_called);
    if ((uv__queue *)local_30._0_8_ != (uv__queue *)0x2) goto LAB_001ddfd9;
    local_30._8_8_ = (uv__queue *)0x2;
    local_30._0_8_ = SEXT48(sv_send_cb_called);
    if ((uv__queue *)local_30._0_8_ != (uv__queue *)0x2) goto LAB_001ddfe8;
    local_30._8_8_ = (uv__queue *)0x2;
    local_30._0_8_ = SEXT48(close_cb_called);
    if ((uv__queue *)local_30._0_8_ != (uv__queue *)0x2) goto LAB_001ddff7;
    auStack_40._0_8_ = (uv__queue *)0x1ddedb;
    uVar2 = uv_default_loop();
    unaff_RBX = (uv__queue *)0x0;
    auStack_40._0_8_ = (uv__queue *)0x1ddef1;
    uv_walk(uVar2,close_walk_cb,0);
    auStack_40._0_8_ = (uv__queue *)0x1ddefb;
    uv_run(uVar2,0);
    local_30._8_8_ = (uv__queue *)0x0;
    auStack_40._0_8_ = (uv__queue *)0x1ddf09;
    uVar2 = uv_default_loop();
    auStack_40._0_8_ = (uv__queue *)0x1ddf11;
    iVar1 = uv_loop_close(uVar2);
    local_30._0_8_ = SEXT48(iVar1);
    if (local_30._8_8_ == local_30._0_8_) {
      auStack_40._0_8_ = (uv__queue *)0x1ddf2d;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_40._0_8_ = (uv__queue *)0x1ddf52;
    run_test_udp_multicast_join_cold_1();
LAB_001ddf52:
    auStack_40._0_8_ = (uv__queue *)0x1ddf61;
    run_test_udp_multicast_join_cold_2();
LAB_001ddf61:
    auStack_40._0_8_ = (uv__queue *)0x1ddf70;
    run_test_udp_multicast_join_cold_3();
LAB_001ddf70:
    auStack_40._0_8_ = (uv__queue *)0x1ddf7f;
    run_test_udp_multicast_join_cold_4();
LAB_001ddf7f:
    auStack_40._0_8_ = (uv__queue *)0x1ddf8e;
    run_test_udp_multicast_join_cold_5();
LAB_001ddf8e:
    auStack_40._0_8_ = (uv__queue *)0x1ddf9d;
    run_test_udp_multicast_join_cold_6();
LAB_001ddf9d:
    auStack_40._0_8_ = (uv__queue *)0x1ddfac;
    run_test_udp_multicast_join_cold_7();
LAB_001ddfac:
    auStack_40._0_8_ = (uv__queue *)0x1ddfbb;
    run_test_udp_multicast_join_cold_8();
LAB_001ddfbb:
    auStack_40._0_8_ = (uv__queue *)0x1ddfca;
    run_test_udp_multicast_join_cold_9();
LAB_001ddfca:
    auStack_40._0_8_ = (uv__queue *)0x1ddfd9;
    run_test_udp_multicast_join_cold_10();
LAB_001ddfd9:
    auStack_40._0_8_ = (uv__queue *)0x1ddfe8;
    run_test_udp_multicast_join_cold_11();
LAB_001ddfe8:
    auStack_40._0_8_ = (uv__queue *)0x1ddff7;
    run_test_udp_multicast_join_cold_12();
LAB_001ddff7:
    auStack_40._0_8_ = (uv__queue *)0x1de006;
    run_test_udp_multicast_join_cold_13();
  }
  puVar7 = (uv_udp_t *)(local_30 + 8);
  puVar5 = (uv__queue *)local_30;
  auStack_40._0_8_ = alloc_cb;
  run_test_udp_multicast_join_cold_14();
  bVar3 = puVar7 == &client || puVar7 == &server;
  puVar4 = (uv__queue *)CONCAT71(0xfccf,bVar3);
  auStack_40._0_8_ = ZEXT18(bVar3);
  uStack_48._0_4_ = 0;
  uStack_48._4_4_ = 0;
  if ((uv__queue *)auStack_40._0_8_ == (uv__queue *)0x0) {
    puStack_58 = (uv__queue *)0x1de092;
    alloc_cb_cold_2();
  }
  else {
    uStack_48._0_4_ = 0x10000;
    uStack_48._4_4_ = 0;
    auStack_40._0_8_ = puVar5;
    if ((long)puVar5 < 0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      return 0xfcd130;
    }
  }
  puVar7 = (uv_udp_t *)auStack_40;
  puVar6 = (uv_handle_t *)&uStack_48;
  puStack_58 = (uv__queue *)cl_recv_cb;
  alloc_cb_cold_1();
  ppuVar8 = &puStack_a8;
  auStack_98[0] = (ulong)(puVar7 == &client || puVar7 == &server);
  puStack_a8 = (uv_handle_t *)0x0;
  puStack_58 = unaff_RBX;
  if (auStack_98[0] == 0) {
    puStack_b0 = (uv__queue *)0x1de267;
    cl_recv_cb_cold_11();
LAB_001de267:
    puStack_b0 = (uv__queue *)0x1de274;
    cl_recv_cb_cold_1();
LAB_001de274:
    puStack_b0 = (uv__queue *)0x1de279;
    cl_recv_cb_cold_10();
LAB_001de279:
    puStack_b0 = (uv__queue *)0x1de27e;
    cl_recv_cb_cold_8();
LAB_001de27e:
    puStack_b0 = (uv__queue *)0x1de28b;
    cl_recv_cb_cold_2();
LAB_001de28b:
    puStack_b0 = (uv__queue *)0x1de290;
    cl_recv_cb_cold_3();
LAB_001de290:
    puStack_b0 = (uv__queue *)0x1de29d;
    cl_recv_cb_cold_4();
LAB_001de29d:
    puStack_b0 = (uv__queue *)0x1de2aa;
    cl_recv_cb_cold_5();
LAB_001de2aa:
    puStack_b0 = (uv__queue *)0x1de2b7;
    cl_recv_cb_cold_6();
  }
  else {
    auStack_98[0] = in_R8 & 0xffffffff;
    puStack_a8 = (uv_handle_t *)0x0;
    if (auStack_98[0] != 0) goto LAB_001de267;
    if ((long)puVar6 < 0) goto LAB_001de274;
    if (puVar6 != (uv_handle_t *)0x0) {
      if (puVar4 == (uv__queue *)0x0) goto LAB_001de279;
      auStack_98[0] = 4;
      puStack_a8 = puVar6;
      if (puVar6 != (uv_handle_t *)0x4) goto LAB_001de27e;
      puStack_b0 = (uv__queue *)0x1de14b;
      iVar1 = bcmp("PING",(void *)*extraout_RDX_00,4);
      if (iVar1 == 0) {
        cl_recv_cb_called = cl_recv_cb_called + 1;
        if (cl_recv_cb_called == 2) {
          iVar1 = uv_close(&server,close_cb);
          return iVar1;
        }
        goto LAB_001de18f;
      }
      goto LAB_001de28b;
    }
    if (puVar4 == (uv__queue *)0x0) {
      return 0;
    }
    puStack_b0 = (uv__queue *)0x1de18f;
    cl_recv_cb_cold_9();
LAB_001de18f:
    puStack_b0 = (uv__queue *)0x1de1a1;
    iVar1 = uv_ip4_name(puVar4,auStack_98,0x40);
    puStack_a8 = (uv_handle_t *)(long)iVar1;
    uStack_a0._0_4_ = 0;
    uStack_a0._4_4_ = 0;
    if (puStack_a8 != (uv_handle_t *)0x0) goto LAB_001de290;
    puStack_b0 = (uv__queue *)0x1de1d6;
    iVar1 = uv_udp_set_membership(&server,"239.255.0.1",0,0);
    puStack_a8 = (uv_handle_t *)(long)iVar1;
    uStack_a0._0_4_ = 0;
    uStack_a0._4_4_ = 0;
    if (puStack_a8 != (uv_handle_t *)0x0) goto LAB_001de29d;
    puStack_b0 = (uv__queue *)0x1de214;
    iVar1 = uv_udp_set_source_membership(&server,"239.255.0.1",0,auStack_98,1);
    puStack_a8 = (uv_handle_t *)(long)iVar1;
    uStack_a0._0_4_ = 0;
    uStack_a0._4_4_ = 0;
    if (puStack_a8 != (uv_handle_t *)0x0) goto LAB_001de2aa;
    puStack_b0 = (uv__queue *)0x1de23a;
    iVar1 = do_send(&req_ss);
    puStack_a8 = (uv_handle_t *)(long)iVar1;
    uStack_a0._0_4_ = 0;
    uStack_a0._4_4_ = 0;
    if (puStack_a8 == (uv_handle_t *)0x0) {
      return iVar1;
    }
  }
  puStack_b0 = (uv__queue *)do_send;
  cl_recv_cb_cold_7();
  pcStack_e8 = (code *)0x1de2dd;
  puStack_b0 = puVar4;
  auStack_d8._8_16_ = uv_buf_init("PING",4);
  pcStack_e8 = (code *)0x1de2fd;
  iVar1 = uv_ip4_addr("239.255.0.1",0x23a3,auStack_c0);
  auStack_d8._0_8_ = SEXT48(iVar1);
  uStack_e0 = 0;
  if ((void *)auStack_d8._0_8_ == (void *)0x0) {
    pcStack_e8 = (code *)0x1de33c;
    iVar1 = uv_udp_send(ppuVar8,&client,auStack_d8 + 8,1,auStack_c0,sv_send_cb);
    return iVar1;
  }
  puVar7 = (uv_udp_t *)auStack_d8;
  pcStack_e8 = close_cb;
  do_send_cold_1();
  bVar3 = puVar7 == &client || puVar7 == &server;
  pcStack_e8 = (code *)(ulong)bVar3;
  uStack_f0 = 0;
  if (pcStack_e8 != (code *)0x0) {
    close_cb_called = close_cb_called + 1;
    return (int)bVar3;
  }
  ppcVar9 = &pcStack_e8;
  iVar1 = (int)&uStack_f0;
  apcStack_100[0] = sv_send_cb;
  close_cb_cold_1();
  if (ppcVar9 == (code **)0x0) {
    sv_send_cb_cold_3();
  }
  else {
    apcStack_100[0] = (code *)(long)iVar1;
    if (apcStack_100[0] == (code *)0x0) {
      puVar7 = (uv_udp_t *)ppcVar9[9];
      apcStack_100[0] = (code *)(ulong)(puVar7 == &client || puVar7 == &server);
      if (apcStack_100[0] != (code *)0x0) {
        sv_send_cb_called = sv_send_cb_called + 1;
        if (sv_send_cb_called != 2) {
          return sv_send_cb_called;
        }
        iVar1 = uv_close(puVar7,close_cb);
        return iVar1;
      }
      goto LAB_001de449;
    }
  }
  sv_send_cb_cold_1();
LAB_001de449:
  ppcVar9 = apcStack_100;
  sv_send_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(ppcVar9,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_multicast_join) {
#if defined(__OpenBSD__)
  RETURN_SKIP("Test does not currently work in OpenBSD");
#endif
  int r;
  struct sockaddr_in addr;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  /* bind to the desired port */
  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  /* join the multicast channel */
  r = uv_udp_set_membership(&server, MULTICAST_ADDR, NULL, UV_JOIN_GROUP);
  if (r == UV_ENODEV)
    RETURN_SKIP("No multicast support.");
  ASSERT_OK(r);
#if defined(__ANDROID__)
  /* It returns an ENOSYS error */
  RETURN_SKIP("Test does not currently work in ANDROID");
#endif

  r = uv_udp_recv_start(&server, alloc_cb, cl_recv_cb);
  ASSERT_OK(r);

  r = do_send(&req);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);
  ASSERT_OK(cl_recv_cb_called);
  ASSERT_OK(sv_send_cb_called);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, cl_recv_cb_called);
  ASSERT_EQ(2, sv_send_cb_called);
  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}